

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O2

void icu_63::MessageImpl::appendReducedApostrophes
               (UnicodeString *s,int32_t start,int32_t limit,UnicodeString *sb)

{
  int32_t iVar1;
  int iVar2;
  
  iVar2 = -1;
  while( true ) {
    iVar1 = UnicodeString::indexOf(s,L'\'',start);
    if ((iVar1 < 0) || (limit <= iVar1)) break;
    if (iVar1 == iVar2) {
      UnicodeString::append(sb,L'\'');
      start = start + 1;
      iVar2 = -1;
    }
    else {
      UnicodeString::doAppend(sb,s,start,iVar1 - start);
      start = iVar1 + 1;
      iVar2 = start;
    }
  }
  UnicodeString::doAppend(sb,s,start,limit - start);
  return;
}

Assistant:

void
MessageImpl::appendReducedApostrophes(const UnicodeString &s, int32_t start, int32_t limit,
                                      UnicodeString &sb) {
    int32_t doubleApos=-1;
    for(;;) {
        int32_t i=s.indexOf(u_apos, start);
        if(i<0 || i>=limit) {
            sb.append(s, start, limit-start);
            break;
        }
        if(i==doubleApos) {
            // Double apostrophe at start-1 and start==i, append one.
            sb.append(u_apos);
            ++start;
            doubleApos=-1;
        } else {
            // Append text between apostrophes and skip this one.
            sb.append(s, start, i-start);
            doubleApos=start=i+1;
        }
    }
}